

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O3

void __thiscall soplex::SPxSolverBase<double>::computeFrhsXtra(SPxSolverBase<double> *this)

{
  double dVar1;
  Representation RVar2;
  Status SVar3;
  int iVar4;
  Status *pSVar5;
  SVSetBase<double> *pSVar6;
  VectorBase<double> *pVVar7;
  Item *pIVar8;
  pointer pdVar9;
  long lVar10;
  undefined8 *puVar11;
  VectorBase<double> *pVVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  int *piVar16;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  lVar10 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
                 set.thenum;
  if (0 < lVar10) {
    pSVar5 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    RVar2 = this->theRep;
    pSVar6 = this->thevectors;
    pVVar7 = this->theFrhs;
    lVar13 = 0;
    do {
      SVar3 = pSVar5[lVar13];
      if (RVar2 * SVar3 < 1) {
        pVVar12 = &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.up;
        switch(SVar3) {
        default:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"ESVECS02 ERROR: ",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"inconsistent basis must not happen!",0x23);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          puVar11 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_48 = local_38;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"XSVECS02 This should never happen.","");
          *puVar11 = &PTR__SPxException_0069d438;
          puVar11[1] = puVar11 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar11 + 1),local_48,local_48 + local_40);
          *puVar11 = &PTR__SPxException_0069d410;
          __cxa_throw(puVar11,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        case P_ON_LOWER:
          pVVar12 = &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.low;
        case P_FIXED:
        case P_ON_UPPER:
          dVar1 = (pVVar12->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            pIVar8 = (pSVar6->set).theitem;
            iVar4 = (pSVar6->set).thekey[lVar13].idx;
            lVar15 = (long)pIVar8[iVar4].data.super_SVectorBase<double>.memused;
            if (0 < lVar15) {
              pdVar9 = (pVVar7->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar14 = lVar15 + 1;
              piVar16 = &pIVar8[iVar4].data.super_SVectorBase<double>.m_elem[lVar15 + -1].idx;
              do {
                pdVar9[*piVar16] =
                     pdVar9[*piVar16] - ((Nonzero<double> *)(piVar16 + -2))->val * dVar1;
                uVar14 = uVar14 - 1;
                piVar16 = piVar16 + -4;
              } while (1 < uVar14);
            }
          }
          break;
        case P_FREE:
          break;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar10);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFrhsXtra()
{

   assert(rep()  == COLUMN);
   assert(type() == LEAVE);

   for(int i = 0; i < this->nCols(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = this->desc().colStatus(i);

      if(!isBasic(stat))
      {
         R x;

         // coverity[switch_selector_expr_is_constant]
         switch(stat)
         {
         // columnwise cases:
         case SPxBasisBase<R>::Desc::P_FREE :
            continue;

         case(SPxBasisBase<R>::Desc::P_FIXED) :
            assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));

         //lint -fallthrough
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            x = SPxLPBase<R>::upper(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            x = SPxLPBase<R>::lower(i);
            break;

         default:
            SPX_MSG_ERROR(std::cerr << "ESVECS02 ERROR: "
                          << "inconsistent basis must not happen!"
                          << std::endl;)
            throw SPxInternalCodeException("XSVECS02 This should never happen.");
         }

         assert(x < R(infinity));
         assert(x > R(-infinity));

         if(x != 0.0)
            theFrhs->multAdd(-x, vector(i));
      }
   }
}